

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::iuUniversalPrinter<std::filesystem::file_status>::Print
               (file_status *value,iu_ostream *os)

{
  iu_ostream *os_local;
  file_status *value_local;
  
  UniversalPrintTo<std::filesystem::file_status>(value,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }